

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedWriters.cpp
# Opt level: O1

int main(void)

{
  __atomic_base<unsigned_long> _Var1;
  atomic<unsigned_long> aVar2;
  Session *__mutex;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  pthread_mutex_t *__mutex_00;
  SessionWriter writer2;
  timespec ts_1;
  SessionWriter writer;
  Session session;
  undefined1 local_348 [24];
  Queue *pQStack_330;
  undefined1 local_318 [17];
  undefined7 uStack_307;
  __pthread_internal_list *p_Stack_300;
  __pthread_internal_list *local_2f8;
  size_t local_2f0;
  __pthread_internal_list local_2e8;
  pthread_mutex_t *local_2d8;
  pthread_mutex_t *local_2d0;
  undefined1 local_2c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  string local_298;
  undefined1 local_278 [16];
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  uint64_t local_208;
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [16];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  uint64_t local_150;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  SessionWriter local_108;
  Session local_d8;
  
  binlog::Session::Session(&local_d8);
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  binlog::SessionWriter::SessionWriter(&local_108,&local_d8,0x100000,0,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  local_2d8 = (pthread_mutex_t *)local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"w1","");
  __mutex = local_108._session;
  if (local_2d8 == (pthread_mutex_t *)local_2c8) {
    pQStack_330 = (Queue *)local_2c8._8_8_;
    local_348._0_8_ = (pthread_mutex_t *)(local_348 + 0x10);
  }
  else {
    local_348._0_8_ = local_2d8;
  }
  local_348._17_7_ = local_2c8._1_7_;
  local_348[0x10] = local_2c8[0];
  local_348._8_8_ = local_2d0;
  local_2d0 = (pthread_mutex_t *)0x0;
  local_2c8[0] = '\0';
  local_2d8 = (pthread_mutex_t *)local_2c8;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_108._session);
  if (iVar3 == 0) {
    std::__cxx11::string::operator=
              ((string *)
               ((long)local_108._channel.
                      super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 8),(string *)local_348);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((pthread_mutex_t *)local_348._0_8_ != (pthread_mutex_t *)(local_348 + 0x10)) {
      operator_delete((void *)local_348._0_8_,(ulong)((long)(_func_int ***)local_348._16_8_ + 1));
    }
    if (local_2d8 != (pthread_mutex_t *)local_2c8) {
      operator_delete(local_2d8,CONCAT71(local_2c8._1_7_,local_2c8[0]) + 1);
    }
    if (0x80 < *(ushort *)((long)local_108._session + 0x88)) {
LAB_001026cf:
      local_2c8._24_8_ = (__pthread_internal_list *)0x0;
      local_2a8._M_local_buf[0] = '\0';
      local_2c8._16_8_ = &local_2a8;
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)local_348,&local_d8,0x100000,0,(string *)(local_2c8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._16_8_ != &local_2a8) {
        operator_delete((void *)local_2c8._16_8_,
                        CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) +
                        1);
      }
      local_2f8 = &local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"w2","");
      __mutex_00 = (pthread_mutex_t *)local_348._8_8_;
      uVar5 = local_348._0_8_;
      if (local_2f8 == &local_2e8) {
        p_Stack_300 = local_2e8.__next;
        local_318._0_8_ = (__pthread_internal_list *)(local_318 + 0x10);
      }
      else {
        local_318._0_8_ = local_2f8;
      }
      stack0xfffffffffffffcf8 = CONCAT71(local_2e8.__prev._1_7_,local_2e8.__prev._0_1_);
      local_318._8_8_ = local_2f0;
      local_2f0 = 0;
      local_2e8.__prev._0_1_ = 0;
      local_2f8 = &local_2e8;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_348._0_8_);
      if (iVar3 == 0) {
        std::__cxx11::string::operator=((string *)(__mutex_00->__size + 8),(string *)local_318);
        pthread_mutex_unlock((pthread_mutex_t *)uVar5);
        if ((__pthread_internal_list *)local_318._0_8_ !=
            (__pthread_internal_list *)(local_318 + 0x10)) {
          operator_delete((void *)local_318._0_8_,stack0xfffffffffffffcf8 + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,CONCAT71(local_2e8.__prev._1_7_,local_2e8.__prev._0_1_) + 1);
        }
        __mutex_00 = (pthread_mutex_t *)local_348._0_8_;
        if (*(ushort *)(local_348._0_8_ + 0x88) < 0x81) {
          if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
            local_278._0_8_ = 0;
            local_278._8_2_ = info;
            local_268._M_p = (pointer)&local_258;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"main","");
            local_248._M_p = (pointer)&local_238;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"main","");
            local_228._M_p = (pointer)&local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/NamedWriters.cpp"
                       ,"");
            local_208 = 0x12;
            local_200._M_p = (pointer)&local_1f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_200,"Hello other named writer","");
            local_318._0_8_ = local_318._0_8_ & 0xffffffffffffff00;
            local_1e0._M_p = (pointer)&local_1d0;
            sVar4 = strlen(local_318);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e0,local_318,local_318 + sVar4);
            iVar3 = pthread_mutex_lock(__mutex_00);
            if (iVar3 != 0) goto LAB_00102b01;
            local_278._0_8_ = __mutex_00[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_278,
                       (RecoverableVectorOutputStream *)((long)__mutex_00 + 0x58));
            _Var1._M_i = __mutex_00[3].__align;
            __mutex_00[3].__align = _Var1._M_i + 1;
            pthread_mutex_unlock(__mutex_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_p != &local_1d0) {
              operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_p != &local_1f0) {
              operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_p != &local_218) {
              operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_p != &local_238) {
              operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_p != &local_258) {
              operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
          }
          aVar2.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
          local_318._0_8_ = (__pthread_internal_list *)0x0;
          local_318._8_8_ = 0;
          clock_gettime(0,(timespec *)local_318);
          binlog::SessionWriter::addEvent<>
                    ((SessionWriter *)local_348,
                     (uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,
                     local_318._0_8_ * 1000000000 + local_318._8_8_);
        }
        binlog::Session::consume<std::ostream>
                  ((ConsumeResult *)local_318,&local_d8,
                   (basic_ostream<char,_std::char_traits<char>_> *)&std::cout);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
        }
        if (local_108._channel.
            super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108._channel.
                     super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_d8._specialEntryBuffer.vector.super__Vector_base<char,_std::allocator<char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8._specialEntryBuffer.vector.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8._specialEntryBuffer.vector.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8._specialEntryBuffer.vector.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[0] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[1] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[2] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[3] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[4] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[5] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[6] = '\0';
        local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[7] = '\0';
        if (local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8._sources._vector.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8._sources._vector.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8._sources._vector.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[0] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[1] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[2] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[3] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[4] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[5] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[6] = '\0';
        local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[7] = '\0';
        if (local_d8._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8._clockSync._vector.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8._clockSync._vector.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8._clockSync._vector.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
        ::~vector(&local_d8._channels);
        return 0;
      }
      goto LAB_00102af3;
    }
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_001026a0:
      aVar2.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      local_348._0_8_ = (pthread_mutex_t *)0x0;
      local_348._8_8_ = (pthread_mutex_t *)0x0;
      clock_gettime(0,(timespec *)local_348);
      binlog::SessionWriter::addEvent<>
                (&local_108,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,
                 (uint64_t)(local_348._8_8_ + local_348._0_8_ * 25000000 * 0x28));
      goto LAB_001026cf;
    }
    local_1c0._0_8_ = 0;
    local_1c0._8_2_ = info;
    local_1b0._M_p = (pointer)&local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"main","");
    local_190._M_p = (pointer)&local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
    local_170._M_p = (pointer)&local_160;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/NamedWriters.cpp"
               ,"");
    local_150 = 0xc;
    local_148._M_p = (pointer)&local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Hello named writer","");
    local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
    local_128._M_p = (pointer)&local_118;
    sVar4 = strlen(local_348);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,local_348,local_348 + sVar4);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_108._session);
    __mutex_00 = (pthread_mutex_t *)local_108._session;
    if (iVar3 == 0) {
      local_1c0._0_8_ = ((pthread_mutex_t *)((long)local_108._session + 0x78))->__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_1c0,
                 (RecoverableVectorOutputStream *)((long)local_108._session + 0x58));
      _Var1._M_i = ((pthread_mutex_t *)((long)local_108._session + 0x78))->__align;
      ((pthread_mutex_t *)((long)local_108._session + 0x78))->__align = _Var1._M_i + 1;
      pthread_mutex_unlock((pthread_mutex_t *)local_108._session);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_p != &local_138) {
        operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
      goto LAB_001026a0;
    }
  }
  else {
    iVar3 = std::__throw_system_error(iVar3);
    __mutex_00 = (pthread_mutex_t *)
                 local_108._channel.
                 super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00102af3:
    iVar3 = std::__throw_system_error(iVar3);
  }
  iVar3 = std::__throw_system_error(iVar3);
LAB_00102b01:
  uVar5 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock(__mutex_00);
  binlog::EventSource::~EventSource((EventSource *)local_278);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
  }
  if (local_108._channel.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108._channel.
               super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  binlog::Session::~Session(&local_d8);
  _Unwind_Resume(uVar5);
}

Assistant:

int main()
{
  binlog::Session session;
  binlog::SessionWriter writer(session);

  //[setName
  writer.setName("w1");
  BINLOG_INFO_W(writer, "Hello named writer");
  // Outputs: w1 Hello named writer
  //]

  binlog::SessionWriter writer2(session);
  writer2.setName("w2");
  BINLOG_INFO_W(writer2, "Hello other named writer");
  // Outputs: w2 Hello other named writer

  session.consume(std::cout);
  return 0;
}